

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particle_belief.cpp
# Opt level: O2

void __thiscall despot::ParticleBelief::Update(ParticleBelief *this,ACT_TYPE action,OBS_TYPE obs)

{
  State *pSVar1;
  DSPOMDP *pDVar2;
  Belief *belief;
  vector<despot::State*,std::allocator<despot::State*>> *this_00;
  int iVar3;
  int iVar4;
  log_ostream *plVar5;
  ostream *poVar6;
  undefined4 extraout_var;
  pointer ppSVar7;
  long lVar8;
  pointer ppSVar9;
  long lVar10;
  _Vector_base<despot::State_*,_std::allocator<despot::State_*>_> *p_Var11;
  History *this_01;
  int i;
  ulong uVar12;
  int i_4;
  int i_1;
  double extraout_XMM0_Qa;
  double dVar13;
  double dVar14;
  State *particle;
  vector<despot::State_*,_std::allocator<despot::State_*>_> updated;
  OBS_TYPE o;
  double reward;
  double local_118;
  _Vector_base<despot::State_*,_std::allocator<despot::State_*>_> local_110;
  History *local_f8;
  OBS_TYPE local_f0;
  _Vector_base<despot::State_*,_std::allocator<despot::State_*>_> local_e8;
  vector<despot::State*,std::allocator<despot::State*>> *local_c8;
  double local_c0;
  _Vector_base<despot::State_*,_std::allocator<despot::State_*>_> local_b8;
  undefined1 local_98 [8];
  History local_90;
  History local_60;
  
  local_f8 = &(this->super_Belief).history_;
  local_f0 = obs;
  History::Add(local_f8,action,obs);
  local_e8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c8 = (vector<despot::State*,std::allocator<despot::State*>> *)&this->particles_;
  local_118 = 0.0;
  for (uVar12 = 0;
      ppSVar7 = (this->particles_).
                super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
                super__Vector_impl_data._M_start,
      uVar12 < (ulong)((long)(this->particles_).
                             super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                             _M_impl.super__Vector_impl_data._M_finish - (long)ppSVar7 >> 3);
      uVar12 = uVar12 + 1) {
    pSVar1 = ppSVar7[uVar12];
    pDVar2 = (this->super_Belief).model_;
    local_110._M_impl.super__Vector_impl_data._M_start = (pointer)pSVar1;
    Random::NextDouble((Random *)&Random::RANDOM);
    iVar3 = (*pDVar2->_vptr_DSPOMDP[2])(pDVar2,pSVar1,(ulong)(uint)action,local_98);
    pDVar2 = (this->super_Belief).model_;
    (*pDVar2->_vptr_DSPOMDP[7])
              (pDVar2,local_f0,local_110._M_impl.super__Vector_impl_data._M_start,
               (ulong)(uint)action);
    if ((char)iVar3 == '\0' && extraout_XMM0_Qa != 0.0) {
      local_c0 = extraout_XMM0_Qa *
                 *(double *)((long)local_110._M_impl.super__Vector_impl_data._M_start + 0x18);
      *(double *)((long)local_110._M_impl.super__Vector_impl_data._M_start + 0x18) = local_c0;
      std::vector<despot::State_*,_std::allocator<despot::State_*>_>::push_back
                ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)&local_e8,
                 (value_type *)&local_110);
      local_118 = local_118 + local_c0;
    }
    else {
      pDVar2 = (this->super_Belief).model_;
      (*pDVar2->_vptr_DSPOMDP[0x17])(pDVar2,local_110._M_impl.super__Vector_impl_data._M_start);
    }
  }
  iVar3 = logging::level();
  this_00 = local_c8;
  if (0 < iVar3) {
    iVar3 = logging::level();
    if (3 < iVar3) {
      plVar5 = logging::stream(4);
      poVar6 = std::operator<<(&plVar5->super_ostream,"[ParticleBelief::Update] ");
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      poVar6 = std::operator<<(poVar6," particles survived among ");
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      std::endl<char,std::char_traits<char>>(poVar6);
    }
  }
  std::vector<despot::State_*,_std::allocator<despot::State_*>_>::operator=
            ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)this_00,
             (vector<despot::State_*,_std::allocator<despot::State_*>_> *)&local_e8);
  ppSVar7 = (this->particles_).super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  lVar8 = (long)(this->particles_).
                super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)ppSVar7;
  if (lVar8 == 0) {
    iVar3 = logging::level();
    if (0 < iVar3) {
      iVar3 = logging::level();
      if (1 < iVar3) {
        plVar5 = logging::stream(2);
        poVar6 = std::operator<<(&plVar5->super_ostream,"Particle set is empty!");
        std::endl<char,std::char_traits<char>>(poVar6);
      }
    }
    if (this->prior_ == (Belief *)0x0) {
      iVar3 = logging::level();
      if (0 < iVar3) {
        iVar3 = logging::level();
        if (1 < iVar3) {
          plVar5 = logging::stream(2);
          poVar6 = std::operator<<(&plVar5->super_ostream,
                                   "Resampling by searching initial particles which are consistent with history"
                                  );
          std::endl<char,std::char_traits<char>>(poVar6);
        }
      }
      iVar3 = this->num_particles_;
      pDVar2 = (this->super_Belief).model_;
      History::History(&local_90,local_f8);
      Resample((vector<despot::State_*,_std::allocator<despot::State_*>_> *)&local_110,iVar3,
               &this->initial_particles_,pDVar2,&local_90,0);
      p_Var11 = &local_110;
      std::vector<despot::State_*,_std::allocator<despot::State_*>_>::_M_move_assign
                ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)this_00);
      iVar3 = (int)p_Var11;
      std::_Vector_base<despot::State_*,_std::allocator<despot::State_*>_>::~_Vector_base
                (&local_110);
      this_01 = &local_90;
    }
    else {
      iVar3 = logging::level();
      if (0 < iVar3) {
        iVar3 = logging::level();
        if (1 < iVar3) {
          plVar5 = logging::stream(2);
          poVar6 = std::operator<<(&plVar5->super_ostream,
                                   "Resampling by drawing random particles from prior which are consistent with history"
                                  );
          std::endl<char,std::char_traits<char>>(poVar6);
        }
      }
      iVar3 = this->num_particles_;
      belief = this->prior_;
      History::History(&local_60,local_f8);
      Resample((vector<despot::State_*,_std::allocator<despot::State_*>_> *)&local_110,iVar3,belief,
               &local_60,0);
      p_Var11 = &local_110;
      std::vector<despot::State_*,_std::allocator<despot::State_*>_>::_M_move_assign
                ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)this_00);
      iVar3 = (int)p_Var11;
      std::_Vector_base<despot::State_*,_std::allocator<despot::State_*>_>::~_Vector_base
                (&local_110);
      this_01 = &local_60;
    }
    History::~History(this_01);
    ppSVar7 = (this->particles_).
              super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppSVar9 = (this->particles_).
              super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if ((ppSVar9 == ppSVar7) && (this->state_indexer_ != (StateIndexer *)0x0)) {
      iVar4 = logging::level();
      if (0 < iVar4) {
        iVar4 = logging::level();
        if (1 < iVar4) {
          plVar5 = logging::stream(2);
          iVar3 = 0x17c5ed;
          poVar6 = std::operator<<(&plVar5->super_ostream,
                                   "Resampling by searching states consistent with last (action, observation) pair"
                                  );
          std::endl<char,std::char_traits<char>>(poVar6);
        }
      }
      Resample((vector<despot::State_*,_std::allocator<despot::State_*>_> *)&local_110,iVar3,
               (this->super_Belief).model_,this->state_indexer_,action,local_f0);
      std::vector<despot::State_*,_std::allocator<despot::State_*>_>::_M_move_assign
                ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)this_00,&local_110);
      std::_Vector_base<despot::State_*,_std::allocator<despot::State_*>_>::~_Vector_base
                (&local_110);
      ppSVar7 = (this->particles_).
                super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      ppSVar9 = (this->particles_).
                super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    }
    if (ppSVar9 == ppSVar7) {
      iVar3 = logging::level();
      if (0 < iVar3) {
        iVar3 = logging::level();
        if (1 < iVar3) {
          plVar5 = logging::stream(2);
          poVar6 = std::operator<<(&plVar5->super_ostream,
                                   "Resampling failed - Using initial particles");
          std::endl<char,std::char_traits<char>>(poVar6);
        }
      }
      uVar12 = 0;
      while( true ) {
        ppSVar7 = (this->initial_particles_).
                  super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if ((ulong)((long)(this->initial_particles_).
                          super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)ppSVar7 >> 3) <= uVar12)
        break;
        pDVar2 = (this->super_Belief).model_;
        iVar3 = (*pDVar2->_vptr_DSPOMDP[0x16])(pDVar2,ppSVar7[uVar12]);
        local_110._M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT44(extraout_var,iVar3);
        std::vector<despot::State*,std::allocator<despot::State*>>::emplace_back<despot::State*>
                  (this_00,(State **)&local_110);
        uVar12 = uVar12 + 1;
      }
      ppSVar7 = (this->particles_).
                super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      ppSVar9 = (this->particles_).
                super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    }
    lVar8 = (long)ppSVar9 - (long)ppSVar7 >> 3;
    local_118 = 0.0;
    for (lVar10 = 0; lVar8 != lVar10; lVar10 = lVar10 + 1) {
      local_118 = local_118 + ppSVar7[lVar10]->weight;
    }
  }
  else {
    lVar8 = lVar8 >> 3;
  }
  dVar13 = 0.0;
  for (lVar10 = 0; lVar8 != lVar10; lVar10 = lVar10 + 1) {
    dVar14 = ppSVar7[lVar10]->weight / local_118;
    ppSVar7[lVar10]->weight = dVar14;
    dVar13 = dVar13 + dVar14 * dVar14;
  }
  iVar3 = this->num_particles_;
  if (1.0 / dVar13 < (double)iVar3 * 0.5) {
    std::vector<despot::State_*,_std::allocator<despot::State_*>_>::vector
              ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)&local_b8,
               (vector<despot::State_*,_std::allocator<despot::State_*>_> *)this_00);
    Sample((vector<despot::State_*,_std::allocator<despot::State_*>_> *)&local_110,iVar3,
           (vector<despot::State_*,_std::allocator<despot::State_*>_> *)&local_b8,
           (this->super_Belief).model_);
    std::_Vector_base<despot::State_*,_std::allocator<despot::State_*>_>::~_Vector_base(&local_b8);
    uVar12 = 0;
    while( true ) {
      ppSVar7 = (this->particles_).
                super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((ulong)((long)(this->particles_).
                        super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (long)ppSVar7 >> 3) <= uVar12)
      break;
      pDVar2 = (this->super_Belief).model_;
      (*pDVar2->_vptr_DSPOMDP[0x17])(pDVar2,ppSVar7[uVar12]);
      uVar12 = uVar12 + 1;
    }
    std::vector<despot::State_*,_std::allocator<despot::State_*>_>::operator=
              ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)this_00,
               (vector<despot::State_*,_std::allocator<despot::State_*>_> *)&local_110);
    std::_Vector_base<despot::State_*,_std::allocator<despot::State_*>_>::~_Vector_base(&local_110);
  }
  std::_Vector_base<despot::State_*,_std::allocator<despot::State_*>_>::~_Vector_base(&local_e8);
  return;
}

Assistant:

void ParticleBelief::Update(ACT_TYPE action, OBS_TYPE obs) {
	history_.Add(action, obs);

	vector<State*> updated;
	double total_weight = 0;
	double reward;
	OBS_TYPE o;
	// Update particles
	for (int i = 0; i <particles_.size(); i++) {
		State* particle = particles_[i];
		bool terminal = model_->Step(*particle, Random::RANDOM.NextDouble(),
			action, reward, o);
		double prob = model_->ObsProb(obs, *particle, action);

		if (!terminal && prob) { // Terminal state is not required to be explicitly represented and may not have any observation
			particle->weight *= prob;
			total_weight += particle->weight;
			updated.push_back(particle);
		} else {
			model_->Free(particle);
		}
	}

	logd << "[ParticleBelief::Update] " << updated.size()
		<< " particles survived among " << particles_.size() << endl;
	particles_ = updated;

	// Resample if the particle set is empty
	if (particles_.size() == 0) {
		logw << "Particle set is empty!" << endl;
		if (prior_ != NULL) {
			logw
				<< "Resampling by drawing random particles from prior which are consistent with history"
				<< endl;
			particles_ = Resample(num_particles_, *prior_, history_);
		} else {
			logw
				<< "Resampling by searching initial particles which are consistent with history"
				<< endl;
			particles_ = Resample(num_particles_, initial_particles_, model_,
				history_);
		}

		if (particles_.size() == 0 && state_indexer_ != NULL) {
			logw
				<< "Resampling by searching states consistent with last (action, observation) pair"
				<< endl;
			particles_ = Resample(num_particles_, model_, state_indexer_,
				action, obs);
		}

		if (particles_.size() == 0) {
			logw << "Resampling failed - Using initial particles" << endl;
			for (int i = 0; i < initial_particles_.size(); i ++)
				particles_.push_back(model_->Copy(initial_particles_[i]));
		}

		//Update total weight so that effective number of particles are computed correctly
		total_weight = 0;
                for (int i = 0; i < particles_.size(); i++) {
		    State* particle = particles_[i];
                    total_weight = total_weight + particle->weight;
                }
	}


	double weight_square_sum = 0;
	for (int i = 0; i < particles_.size(); i++) {
		State* particle = particles_[i];
		particle->weight /= total_weight;
		weight_square_sum += particle->weight * particle->weight;
	}

	// Resample if the effective number of particles is "small"
	double num_effective_particles = 1.0 / weight_square_sum;
	if (num_effective_particles < num_particles_ / 2.0) {
		vector<State*> new_belief = Sample(num_particles_, particles_,
			model_);
		for (int i = 0; i < particles_.size(); i++)
			model_->Free(particles_[i]);

		particles_ = new_belief;
	}
}